

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_mp3dec_f32_to_s16(float *in,ma_int16 *out,size_t num_samples)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  short sVar6;
  ma_dr_mp3_f4 scale;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar4 = _DAT_00194660;
  auVar3 = _DAT_001944e0;
  for (uVar5 = 0; uVar5 < (num_samples & 0xfffffffffffffff8); uVar5 = uVar5 + 8) {
    pfVar1 = in + uVar5;
    pfVar2 = in + uVar5 + 4;
    auVar7._0_4_ = *pfVar1 * 32768.0;
    auVar7._4_4_ = pfVar1[1] * 32768.0;
    auVar7._8_4_ = pfVar1[2] * 32768.0;
    auVar7._12_4_ = pfVar1[3] * 32768.0;
    auVar10._0_4_ = *pfVar2 * 32768.0;
    auVar10._4_4_ = pfVar2[1] * 32768.0;
    auVar10._8_4_ = pfVar2[2] * 32768.0;
    auVar10._12_4_ = pfVar2[3] * 32768.0;
    auVar7 = minps(auVar7,auVar3);
    auVar7 = maxps(auVar7,auVar4);
    auVar8._0_4_ = (int)auVar7._0_4_;
    auVar8._4_4_ = (int)auVar7._4_4_;
    auVar8._8_4_ = (int)auVar7._8_4_;
    auVar8._12_4_ = (int)auVar7._12_4_;
    auVar7 = minps(auVar10,auVar3);
    auVar7 = maxps(auVar7,auVar4);
    auVar11._0_4_ = (int)auVar7._0_4_;
    auVar11._4_4_ = (int)auVar7._4_4_;
    auVar11._8_4_ = (int)auVar7._8_4_;
    auVar11._12_4_ = (int)auVar7._12_4_;
    auVar7 = packssdw(auVar8,auVar11);
    *(undefined1 (*) [16])(out + uVar5) = auVar7;
  }
  for (; uVar5 < num_samples; uVar5 = uVar5 + 1) {
    fVar9 = in[uVar5] * 32768.0;
    sVar6 = 0x7fff;
    if ((fVar9 < 32766.5) && (sVar6 = -0x8000, -32767.5 < fVar9)) {
      sVar6 = (short)(int)(fVar9 + 0.5);
      sVar6 = (sVar6 >> 0xf) + sVar6;
    }
    out[uVar5] = sVar6;
  }
  return;
}

Assistant:

MA_API void ma_dr_mp3dec_f32_to_s16(const float *in, ma_int16 *out, size_t num_samples)
{
    size_t i = 0;
#if MA_DR_MP3_HAVE_SIMD
    size_t aligned_count = num_samples & ~7;
    for(; i < aligned_count; i+=8)
    {
        ma_dr_mp3_f4 scale = MA_DR_MP3_VSET(32768.0f);
        ma_dr_mp3_f4 a = MA_DR_MP3_VMUL(MA_DR_MP3_VLD(&in[i  ]), scale);
        ma_dr_mp3_f4 b = MA_DR_MP3_VMUL(MA_DR_MP3_VLD(&in[i+4]), scale);
#if MA_DR_MP3_HAVE_SSE
        ma_dr_mp3_f4 s16max = MA_DR_MP3_VSET( 32767.0f);
        ma_dr_mp3_f4 s16min = MA_DR_MP3_VSET(-32768.0f);
        __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, s16max), s16min)),
                                        _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, s16max), s16min)));
        out[i  ] = (ma_int16)_mm_extract_epi16(pcm8, 0);
        out[i+1] = (ma_int16)_mm_extract_epi16(pcm8, 1);
        out[i+2] = (ma_int16)_mm_extract_epi16(pcm8, 2);
        out[i+3] = (ma_int16)_mm_extract_epi16(pcm8, 3);
        out[i+4] = (ma_int16)_mm_extract_epi16(pcm8, 4);
        out[i+5] = (ma_int16)_mm_extract_epi16(pcm8, 5);
        out[i+6] = (ma_int16)_mm_extract_epi16(pcm8, 6);
        out[i+7] = (ma_int16)_mm_extract_epi16(pcm8, 7);
#else
        int16x4_t pcma, pcmb;
        a = MA_DR_MP3_VADD(a, MA_DR_MP3_VSET(0.5f));
        b = MA_DR_MP3_VADD(b, MA_DR_MP3_VSET(0.5f));
        pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, MA_DR_MP3_VSET(0)))));
        pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, MA_DR_MP3_VSET(0)))));
        vst1_lane_s16(out+i  , pcma, 0);
        vst1_lane_s16(out+i+1, pcma, 1);
        vst1_lane_s16(out+i+2, pcma, 2);
        vst1_lane_s16(out+i+3, pcma, 3);
        vst1_lane_s16(out+i+4, pcmb, 0);
        vst1_lane_s16(out+i+5, pcmb, 1);
        vst1_lane_s16(out+i+6, pcmb, 2);
        vst1_lane_s16(out+i+7, pcmb, 3);
#endif
    }
#endif
    for(; i < num_samples; i++)
    {
        float sample = in[i] * 32768.0f;
        if (sample >=  32766.5f)
            out[i] = (ma_int16) 32767;
        else if (sample <= -32767.5f)
            out[i] = (ma_int16)-32768;
        else
        {
            short s = (ma_int16)(sample + .5f);
            s -= (s < 0);
            out[i] = s;
        }
    }
}